

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

void __thiscall implementations::scheme::SchemeFrame::nextArgument(SchemeFrame *this)

{
  bool bVar1;
  reference value;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_18;
  SchemeFrame *local_10;
  SchemeFrame *this_local;
  
  local_10 = this;
  local_18._M_current =
       (cell *)std::
               vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ::cend(&this->arguments);
  bVar1 = __gnu_cxx::operator==(&this->arg_it,&local_18);
  if (bVar1) {
    dispatch(this);
  }
  else {
    value = __gnu_cxx::
            __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
            ::operator*(&this->arg_it);
    bVar1 = resolveArgument(this,value);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
      ::operator++(&this->arg_it);
      nextArgument(this);
    }
  }
  return;
}

Assistant:

void nextArgument() {
		if (arg_it == arguments.cend())
			dispatch();
		else if (resolveArgument(*arg_it)) {
			++arg_it;
			nextArgument();
		}
	}